

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jobs.c
# Opt level: O0

sx_job_t sx_job_dispatch(sx_job_context *ctx,int count,sx_job_cb *callback,void *user,
                        sx_job_priority priority,uint tags)

{
  sx_lock_t sVar1;
  uint32_t uVar2;
  code *pcVar3;
  bool bVar4;
  _Bool _Var5;
  int iVar6;
  sx_job_t puVar7;
  long *plVar8;
  sx_lock_t *psVar9;
  sx__job *node;
  sx__job_pending *psVar10;
  uint32_t local_160;
  uint32_t local_15c;
  sx_job_t local_158;
  sx__job_pending pending;
  int local_128;
  int i_1;
  int range_end;
  int range_start;
  int _i_330;
  int _i_312;
  sx_job_t counter;
  int num_jobs;
  int range_reminder;
  int range_size;
  int ic;
  int i;
  int num_workers;
  sx__job_thread_data *tdata;
  uint tags_local;
  sx_job_priority priority_local;
  void *user_local;
  sx_job_cb *callback_local;
  int count_local;
  sx_job_context *ctx_local;
  
  if (count < 1) {
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/jobs.c",
                      0x11f,"count > 0");
    pcVar3 = (code *)swi(3);
    puVar7 = (sx_job_t)(*pcVar3)();
    return puVar7;
  }
  plVar8 = (long *)sx_tls_get(ctx->thread_tls);
  ic = 0;
  if (tags == 0) {
    ic = ctx->num_threads + 1;
  }
  else {
    range_size = 0;
    for (; range_size < ctx->num_threads + 1; range_size = range_size + 1) {
      if ((ctx->tags[range_size] & tags) != 0) {
        ic = ic + 1;
      }
    }
  }
  iVar6 = count / ic;
  counter._4_4_ = count % ic;
  if (iVar6 < 1) {
    local_160 = counter._4_4_;
    if ((int)counter._4_4_ < 1) {
      local_160 = 0;
    }
    local_15c = local_160;
  }
  else {
    local_15c = ic;
  }
  if ((int)local_15c < 1) {
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/jobs.c",
                      0x132,"num_jobs > 0");
    pcVar3 = (code *)swi(3);
    puVar7 = (sx_job_t)(*pcVar3)();
    return puVar7;
  }
  if (ctx->job_pool->capacity < (int)local_15c) {
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/jobs.c",
                      0x134,"this amount of jobs at a time cannot be done. increase max_jobs");
    pcVar3 = (code *)swi(3);
    puVar7 = (sx_job_t)(*pcVar3)();
    return puVar7;
  }
  psVar9 = &ctx->counter_lk;
  while( true ) {
    LOCK();
    sVar1 = *psVar9;
    *psVar9 = 1;
    UNLOCK();
    if (sVar1 == 0) break;
    do {
    } while (*psVar9 != 0);
  }
  bVar4 = false;
  while (!bVar4) {
    _Var5 = sx_pool_full(ctx->counter_pool);
    if (_Var5) {
      sx_pool_grow(ctx->counter_pool,ctx->alloc,
                   "/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/jobs.c",
                   "sx_job_t sx_job_dispatch(sx_job_context *, int, sx_job_cb *, void *, sx_job_priority, unsigned int)"
                   ,0x139);
    }
    __i_330 = (sx_job_t)sx_pool_new(ctx->counter_pool);
    ctx->counter_lk = 0;
    bVar4 = true;
  }
  if (__i_330 != (sx_job_t)0x0) {
    *__i_330 = local_15c;
    if (plVar8 == (long *)0x0) {
      sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/jobs.c",
                        0x142,"Dispatch must be called within main thread or job threads");
      pcVar3 = (code *)swi(3);
      puVar7 = (sx_job_t)(*pcVar3)();
      return puVar7;
    }
    if (*plVar8 != 0) {
      *(sx_job_t *)(*plVar8 + 0x38) = __i_330;
    }
    psVar9 = &ctx->job_lk;
    while( true ) {
      LOCK();
      sVar1 = *psVar9;
      *psVar9 = 1;
      UNLOCK();
      if (sVar1 == 0) break;
      do {
      } while (*psVar9 != 0);
    }
    bVar4 = false;
    do {
      if (bVar4) {
        return __i_330;
      }
      _Var5 = sx_pool_fulln(ctx->job_pool,local_15c);
      if (_Var5) {
        local_158 = __i_330;
        pending.counter._4_4_ = counter._4_4_;
        pending.counter._0_4_ = iVar6;
        pending._8_8_ = callback;
        pending.callback = (sx_job_cb *)user;
        pending.user._0_4_ = priority;
        pending.user._4_4_ = tags;
        if ((ctx->pending == (sx__job_pending *)0x0) ||
           ((int)ctx->pending[-1].priority <= (int)(ctx->pending[-1].tags + 1))) {
          psVar10 = (sx__job_pending *)
                    sx__sbgrowf(ctx->pending,1,0x28,ctx->alloc,
                                "/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/jobs.c"
                                ,"sx_job_dispatch",0x166);
          ctx->pending = psVar10;
        }
        psVar10 = ctx->pending;
        uVar2 = ctx->pending[-1].tags;
        ctx->pending[-1].tags = uVar2 + 1;
        memcpy(psVar10 + (int)uVar2,&local_158,0x28);
      }
      else {
        i_1 = 0;
        local_128 = iVar6 + (uint)(0 < (int)counter._4_4_);
        for (pending.tags = 0; counter._4_4_ = counter._4_4_ - 1, (int)pending.tags < (int)local_15c
            ; pending.tags = pending.tags + 1) {
          node = sx__new_job(ctx,pending.tags,callback,user,i_1,local_128,__i_330,tags,priority);
          sx__job_add_list(ctx->waiting_list + priority,ctx->waiting_list_last + priority,node);
          i_1 = local_128;
          local_128 = iVar6 + (uint)(0 < (int)counter._4_4_) + local_128;
        }
        if (0 < (int)counter._4_4_) {
          sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/jobs.c"
                            ,0x158,"range_reminder <= 0");
          pcVar3 = (code *)swi(3);
          puVar7 = (sx_job_t)(*pcVar3)();
          return puVar7;
        }
        sx_semaphore_post(&ctx->sem,local_15c);
      }
      bVar4 = true;
      ctx->job_lk = 0;
    } while( true );
  }
  sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/jobs.c",0x13d
                    ,"Maximum job instances exceeded");
  pcVar3 = (code *)swi(3);
  puVar7 = (sx_job_t)(*pcVar3)();
  return puVar7;
}

Assistant:

sx_job_t sx_job_dispatch(sx_job_context* ctx, int count, sx_job_cb* callback, void* user,
                         sx_job_priority priority, unsigned int tags)
{
    sx_assert(count > 0);

    sx__job_thread_data* tdata = (sx__job_thread_data*)sx_tls_get(ctx->thread_tls);

    // Divide job count into ranges
    // check which threads are eligible to execute this task (based on tags)
    int num_workers = 0;
    if (tags != 0) {
        for (int i = 0, ic = ctx->num_threads + 1; i < ic; i++) {
            if (ctx->tags[i] & tags)
                num_workers++;
        }
    } else {
        num_workers = ctx->num_threads + 1;
    }

    int range_size = count / num_workers;
    int range_reminder = count % num_workers;
    int num_jobs = range_size > 0 ? num_workers : (range_reminder > 0 ? range_reminder : 0);
    sx_assert(num_jobs > 0);
    sx_assertf(num_jobs <= ctx->job_pool->capacity,
              "this amount of jobs at a time cannot be done. increase max_jobs");

    // Create a counter (job handle)
    sx_job_t counter;
    sx_lock(ctx->counter_lk) {
        counter = (sx_job_t)sx_pool_new_and_grow(ctx->counter_pool, ctx->alloc);
    }

    if (!counter) {
        sx_assertf(0, "Maximum job instances exceeded");
        return NULL;
    }

    sx_atomic_store32_explicit(counter, (uint32_t)num_jobs, SX_ATOMIC_MEMORYORDER_RELEASE);
    sx_assertf(tdata, "Dispatch must be called within main thread or job threads");

    // Another job is running on this thread. So depend the current running job to the new
    // dispatches
    if (tdata->cur_job)
        tdata->cur_job->wait_counter = counter;

    // Push jobs to the end of the list, so they can be collected by threads
    sx_lock(ctx->job_lk) {
        if (!sx_pool_fulln(ctx->job_pool, num_jobs)) {
            int range_start = 0;
            int range_end = range_size + (range_reminder > 0 ? 1 : 0);
            --range_reminder;

            for (int i = 0; i < num_jobs; i++) {
                sx__job_add_list(&ctx->waiting_list[priority], &ctx->waiting_list_last[priority],
                                 sx__new_job(ctx, i, callback, user, range_start, range_end, counter,
                                             tags, priority));
                range_start = range_end;
                range_end += (range_size + (range_reminder > 0 ? 1 : 0));
                --range_reminder;
            }
            sx_assert(range_reminder <= 0);

            // Post to semaphore to worker threads start cur_job
            sx_semaphore_post(&ctx->sem, num_jobs);
        } else {
            SX_PRAGMA_DIAGNOSTIC_PUSH()
            SX_PRAGMA_DIAGNOSTIC_IGNORED_MSVC(4204)     // nonstandard extension used: non-constant aggregate initializer
            sx__job_pending pending = { .counter = counter,
                                        .range_size = range_size,
                                        .range_reminder = range_reminder,
                                        .callback = callback,
                                        .user = user,
                                        .priority = priority,
                                        .tags = tags };
            sx_array_push(ctx->alloc, ctx->pending, pending);
            SX_PRAGMA_DIAGNOSTIC_POP()   
        }
    }   // lock

    return counter;
}